

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorFactory.cpp
# Opt level: O0

shared_ptr<ApprovalTests::ApprovalComparator>
ApprovalTests::ComparatorFactory::getComparatorForFileExtensionWithDot(string *fileExtensionWithDot)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<ApprovalTests::ApprovalComparator> *in_RDI;
  shared_ptr<ApprovalTests::ApprovalComparator> sVar3;
  iterator iterator;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>_>
  *in_stack_ffffffffffffffb8;
  shared_ptr<ApprovalTests::ApprovalComparator> *this;
  _Self local_20;
  _Self local_18 [3];
  
  this = in_RDI;
  comparators_abi_cxx11_();
  local_18[0]._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x1665dd);
  comparators_abi_cxx11_();
  local_20._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = ::std::operator!=(local_18,&local_20);
  if (bVar1) {
    ::std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>
                  *)0x166613);
    ::std::shared_ptr<ApprovalTests::ApprovalComparator>::shared_ptr
              (this,(shared_ptr<ApprovalTests::ApprovalComparator> *)in_stack_ffffffffffffffb8);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    ::std::make_shared<ApprovalTests::TextFileComparator>();
    ::std::shared_ptr<ApprovalTests::ApprovalComparator>::
    shared_ptr<ApprovalTests::TextFileComparator,void>
              (this,(shared_ptr<ApprovalTests::TextFileComparator> *)in_stack_ffffffffffffffb8);
    ::std::shared_ptr<ApprovalTests::TextFileComparator>::~shared_ptr
              ((shared_ptr<ApprovalTests::TextFileComparator> *)0x166649);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<ApprovalTests::ApprovalComparator>)
         sVar3.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ApprovalComparator>
    ComparatorFactory::getComparatorForFileExtensionWithDot(
        const std::string& fileExtensionWithDot)
    {
        auto iterator = comparators().find(fileExtensionWithDot);
        if (iterator != comparators().end())
        {
            return iterator->second;
        }
        return std::make_shared<TextFileComparator>();
    }